

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqtt.c
# Opt level: O0

int lws_mqtt_client_send_unsubcribe(lws *wsi,lws_mqtt_subscribe_param_t *unsub)

{
  char *src;
  uint8_t uVar1;
  int iVar2;
  int iVar3;
  uint8_t *p_00;
  lws *wsi_00;
  lws_mqtt_subs_t *plVar4;
  uchar *puVar5;
  size_t sVar6;
  uint8_t *puVar7;
  uint16_t uVar8;
  lws_mqtt_subs_t *mysub;
  uint32_t tops;
  uint32_t n;
  uint32_t rem_len;
  uint8_t orphaned;
  uint8_t send_unsub [8];
  lws_mqtt_str_t mqtt_vh_payload;
  lws *nwsi;
  uint8_t *p;
  uint8_t *start;
  uint8_t *b;
  lws_context_per_thread *pt;
  lws_mqtt_subscribe_param_t *unsub_local;
  lws *wsi_local;
  
  puVar5 = wsi->context->pt[wsi->tsi].serv_buf;
  p_00 = puVar5 + 0x10;
  wsi_00 = lws_get_network_wsi(wsi);
  _lws_log(8,"%s: Enter\n","lws_mqtt_client_send_unsubcribe");
  if ((short)wsi->wsistate == 0x119) {
    n._3_1_ = 0;
    memset(&rem_len,0,8);
    for (mysub._4_4_ = 0; mysub._4_4_ < unsub->num_topics; mysub._4_4_ = mysub._4_4_ + 1) {
      plVar4 = lws_mqtt_find_sub(wsi_00->mqtt,unsub->topic[mysub._4_4_].name);
      if (plVar4 == (lws_mqtt_subs_t *)0x0) {
        __assert_fail("mysub",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/dmikushin[P]libwebsockets/lib/roles/mqtt/mqtt.c"
                      ,0x79c,
                      "int lws_mqtt_client_send_unsubcribe(struct lws *, const lws_mqtt_subscribe_param_t *)"
                     );
      }
      uVar1 = plVar4->ref_count + 0xff;
      plVar4->ref_count = uVar1;
      if (uVar1 == '\0') {
        _lws_log(4,"%s: Need to send UNSUB\n","lws_mqtt_client_send_unsubcribe");
        *(undefined1 *)((long)&rem_len + (ulong)mysub._4_4_) = 1;
        n._3_1_ = n._3_1_ + 1;
      }
    }
    if (n._3_1_ == 0) {
      _lws_log(4,"%s: unsubscribed!\n","lws_mqtt_client_send_unsubcribe");
      iVar2 = user_callback_handle_rxflow
                        (wsi->protocol->callback,wsi,LWS_CALLBACK_MQTT_UNSUBSCRIBED,wsi->user_space,
                         (void *)0x0,0);
      if (iVar2 < 0) {
        wsi_local._4_4_ = 1;
      }
      else {
        wsi_local._4_4_ = 0;
      }
    }
    else {
      puVar5 = puVar5 + 0x11;
      iVar2 = lws_mqtt_fill_fixed_header(p_00,LMQCP_CTOS_UNSUBSCRIBE,'\0',QOS0,'\0');
      if (iVar2 == 0) {
        tops = 2;
        for (mysub._4_4_ = 0; mysub._4_4_ < unsub->num_topics; mysub._4_4_ = mysub._4_4_ + 1) {
          if (*(char *)((long)&rem_len + (ulong)mysub._4_4_) != '\0') {
            sVar6 = strlen(unsub->topic[mysub._4_4_].name);
            tops = tops + (int)sVar6 + 2;
          }
        }
        wsi->mqtt->sub_size = (uint16_t)tops;
        _lws_log(0x10,"%s: Number of topics = %d, Remaining len = %d\n",
                 "lws_mqtt_client_send_unsubcribe",(ulong)n._3_1_,(ulong)tops);
        iVar3 = lws_mqtt_vbi_encode(tops,puVar5);
        iVar2 = (int)p_00;
        if (tops + ((int)(puVar5 + iVar3) - iVar2) < wsi->context->pt_serv_buf_size) {
          lws_mqtt_str_init((lws_mqtt_str_t *)send_unsub,puVar5 + iVar3,(uint16_t)tops,'\0');
          puVar7 = lws_mqtt_str_next((lws_mqtt_str_t *)send_unsub,(uint16_t *)0x0);
          uVar8 = wsi->mqtt->pkt_id + 1;
          wsi->mqtt->pkt_id = uVar8;
          wsi->mqtt->ack_pkt_id = uVar8;
          lws_ser_wu16be(puVar7,wsi->mqtt->ack_pkt_id);
          iVar3 = lws_mqtt_str_advance((lws_mqtt_str_t *)send_unsub,2);
          if (iVar3 == 0) {
            nwsi = (lws *)lws_mqtt_str_next((lws_mqtt_str_t *)send_unsub,(uint16_t *)0x0);
            for (mysub._4_4_ = 0; mysub._4_4_ < unsub->num_topics; mysub._4_4_ = mysub._4_4_ + 1) {
              _lws_log(8,"%s: topics[%d] = %s\n","lws_mqtt_client_send_unsubcribe",
                       (ulong)mysub._4_4_,unsub->topic[mysub._4_4_].name);
              if (*(char *)((long)&rem_len + (ulong)mysub._4_4_) != '\0') {
                sVar6 = strlen(unsub->topic[mysub._4_4_].name);
                lws_ser_wu16be((uint8_t *)nwsi,(uint16_t)sVar6);
                iVar3 = lws_mqtt_str_advance((lws_mqtt_str_t *)send_unsub,2);
                if (iVar3 != 0) {
                  return 1;
                }
                puVar7 = lws_mqtt_str_next((lws_mqtt_str_t *)send_unsub,(uint16_t *)0x0);
                src = unsub->topic[mysub._4_4_].name;
                sVar6 = strlen(unsub->topic[mysub._4_4_].name);
                lws_strncpy((char *)puVar7,src,sVar6 + 1);
                sVar6 = strlen(unsub->topic[mysub._4_4_].name);
                iVar3 = lws_mqtt_str_advance((lws_mqtt_str_t *)send_unsub,(int)sVar6);
                if (iVar3 != 0) {
                  return 1;
                }
                nwsi = (lws *)lws_mqtt_str_next((lws_mqtt_str_t *)send_unsub,(uint16_t *)0x0);
              }
            }
            iVar3 = lws_write(wsi_00,p_00,(long)((int)nwsi - iVar2),LWS_WRITE_BINARY);
            if (iVar3 == (int)nwsi - iVar2) {
              wsi->mqtt->field_0xfe = wsi->mqtt->field_0xfe & 0xef | 0x10;
              wsi_local._4_4_ = 0;
            }
            else {
              wsi_local._4_4_ = 1;
            }
          }
          else {
            wsi_local._4_4_ = 1;
          }
        }
        else {
          _lws_log(1,"%s: Payload is too big\n","lws_mqtt_client_send_unsubcribe");
          wsi_local._4_4_ = 1;
        }
      }
      else {
        _lws_log(1,"%s: Failed to fill fixed header\n","lws_mqtt_client_send_unsubcribe");
        wsi_local._4_4_ = 1;
      }
    }
  }
  else {
    wsi_local._4_4_ = 1;
  }
  return wsi_local._4_4_;
}

Assistant:

int
lws_mqtt_client_send_unsubcribe(struct lws *wsi,
				const lws_mqtt_subscribe_param_t *unsub)
{
	struct lws_context_per_thread *pt = &wsi->context->pt[(int)wsi->tsi];
	uint8_t *b = (uint8_t *)pt->serv_buf + LWS_PRE, *start = b, *p = start;
	struct lws *nwsi = lws_get_network_wsi(wsi);
	lws_mqtt_str_t mqtt_vh_payload;
	uint8_t send_unsub[8], orphaned;
	uint32_t rem_len, n;
	uint32_t __attribute__((unused)) tops;
	lws_mqtt_subs_t *mysub;

	lwsl_info("%s: Enter\n", __func__);

	switch (lwsi_state(wsi)) {
	case LRS_ESTABLISHED: /* Protocol connection established */
		orphaned = 0;
		memset(&send_unsub, 0, sizeof(send_unsub));
		for (n = 0; n < unsub->num_topics; n++) {
			mysub = lws_mqtt_find_sub(nwsi->mqtt,
						  unsub->topic[n].name);
			assert(mysub);

			if (--mysub->ref_count == 0) {
				lwsl_notice("%s: Need to send UNSUB\n", __func__);
				send_unsub[n] = 1;
				orphaned++;
			}
		}

		if (!orphaned) {
			/*
			 * The nwsi still has other subscribers bound to the
			 * topics.
			 *
			 * So, don't send UNSUB to server, and just fake the
			 * UNSUB ACK event for the guy going away.
			 */
			lwsl_notice("%s: unsubscribed!\n", __func__);
			if (user_callback_handle_rxflow(
				    wsi->protocol->callback,
				    wsi, LWS_CALLBACK_MQTT_UNSUBSCRIBED,
				    wsi->user_space, NULL, 0) < 0) {
				/*
				 * We can't directly close here, because the
				 * caller still has the wsi.  Inform the
				 * caller that we want to close
				 */

				return 1;
			}

			return 0;
		}

		/*
		 * one or more of the topics needs to be unsubscribed
		 * from, so we must go to the server with a filtered
		 * list of the new ones only
		 */

		tops = orphaned;

		if (lws_mqtt_fill_fixed_header(p++, LMQCP_CTOS_UNSUBSCRIBE,
					       0, 0, 0)) {
			lwsl_err("%s: Failed to fill fixed header\n", __func__);
			return 1;
		}

		/*
		 * Pid + (Topic len field + Topic len) x Num of Topics
		 */
		rem_len = 2;
		for (n = 0; n < unsub->num_topics; n++)
			if (send_unsub[n])
				rem_len += (2 + strlen(unsub->topic[n].name));

		wsi->mqtt->sub_size = rem_len;

		lwsl_debug("%s: Number of topics = %d, Remaining len = %d\n",
			   __func__, (int)tops, (int)rem_len);

		p += lws_mqtt_vbi_encode(rem_len, p);

		if ((rem_len + lws_ptr_diff(p, start)) >=
					       wsi->context->pt_serv_buf_size) {
			lwsl_err("%s: Payload is too big\n", __func__);
			return 1;
		}

		/* Init lws_mqtt_str */
		lws_mqtt_str_init(&mqtt_vh_payload, (uint8_t *)p, rem_len, 0);
		p = lws_mqtt_str_next(&mqtt_vh_payload, NULL);

		/* Packet ID */
		wsi->mqtt->ack_pkt_id = ++wsi->mqtt->pkt_id;
		lws_ser_wu16be(p, wsi->mqtt->ack_pkt_id);

		if (lws_mqtt_str_advance(&mqtt_vh_payload, 2))
			return 1;

		p = lws_mqtt_str_next(&mqtt_vh_payload, NULL);

		for (n = 0; n < unsub->num_topics; n++) {
			lwsl_info("%s: topics[%d] = %s\n", __func__,
				   (int)n, unsub->topic[n].name);

			/*
			 * Subscriber still bound to it, don't UBSUB
			 * from the server
			 */
			if (!send_unsub[n])
				continue;

			/* Topic's Len */
			lws_ser_wu16be(p, strlen(unsub->topic[n].name));
			if (lws_mqtt_str_advance(&mqtt_vh_payload, 2))
				return 1;
			p = lws_mqtt_str_next(&mqtt_vh_payload, NULL);

			/* Topic Name */
			lws_strncpy((char *)p, unsub->topic[n].name,
				    strlen(unsub->topic[n].name) + 1);
			if (lws_mqtt_str_advance(&mqtt_vh_payload,
						 strlen(unsub->topic[n].name)))
				return 1;
			p = lws_mqtt_str_next(&mqtt_vh_payload, NULL);
		}
		break;

	default:
		return 1;
	}

	if (lws_write(nwsi, start, lws_ptr_diff(p, start), LWS_WRITE_BINARY) !=
					lws_ptr_diff(p, start))
		return 1;

	wsi->mqtt->inside_unsubscribe = 1;

	return 0;
}